

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionHandler::
handleExpr<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>const&>
          (AssertionHandler *this,
          ExprLhs<const_duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_&>
          *expr)

{
  ITransientExpression local_20;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *local_10;
  
  local_10 = expr->m_lhs;
  local_20.m_result =
       (local_10->super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)._M_t
       .super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
       super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl != (DataChunk *)0x0;
  local_20.m_isBinaryExpression = false;
  local_20._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005d0ff8;
  handleExpr(this,&local_20);
  ITransientExpression::~ITransientExpression(&local_20);
  return;
}

Assistant:

auto makeUnaryExpr() const -> UnaryExpr<LhsT> {
            return UnaryExpr<LhsT>{ m_lhs };
        }